

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O2

void __thiscall cab_manager::update_cab(cab_manager *this,id_type id,node_type from,node_type to)

{
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *this_01;
  __shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *__r;
  long lVar3;
  cab_manager *this_02;
  long lVar4;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  _Var5;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it;
  node_type local_5a;
  node_type local_59;
  cab_manager *local_58;
  id_type local_4c;
  id_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  pointer local_38;
  
  this_00 = &this->_cabs_at_node;
  local_5a = to;
  local_59 = from;
  local_58 = this;
  local_4c = id;
  pmVar2 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_59);
  __it._M_current =
       (pmVar2->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pmVar2 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_59);
  local_38 = (pmVar2->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)local_38 - (long)__it._M_current;
  local_48 = &local_4c;
  for (lVar4 = lVar3 >> 6; _Var5._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_48,__it);
    this_02 = local_58;
    if (bVar1) goto LAB_001578a0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_48,__it._M_current + 1);
    this_02 = local_58;
    _Var5._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_001578a0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_48,__it._M_current + 2);
    this_02 = local_58;
    _Var5._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_001578a0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_48,__it._M_current + 3);
    this_02 = local_58;
    _Var5._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_001578a0;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x40;
  }
  lVar3 = lVar3 >> 4;
  this_02 = local_58;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var5._M_current = local_38;
      if ((lVar3 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::
                  operator()((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                              *)&local_48,__it), this_02 = local_58,
         _Var5._M_current = __it._M_current, bVar1)) goto LAB_001578a0;
      _Var5._M_current = __it._M_current + 1;
    }
    this_02 = local_58;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_48,_Var5);
    if (bVar1) goto LAB_001578a0;
    __it._M_current = _Var5._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                    ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *)
                     &local_48,__it);
  _Var5._M_current = local_38;
  if (bVar1) {
    _Var5._M_current = __it._M_current;
  }
LAB_001578a0:
  pmVar2 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_59);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::erase
            (pmVar2,(const_iterator)_Var5._M_current);
  this_01 = (vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *)
            std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](this_00,&local_5a);
  __r = &std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this_02,&local_4c)->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
  std::__weak_ptr<cab,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab,void>
            ((__weak_ptr<cab,(__gnu_cxx::_Lock_policy)2> *)&local_48,__r);
  std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>::
  emplace_back<std::weak_ptr<cab>>(this_01,(weak_ptr<cab> *)&local_48);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_40);
  return;
}

Assistant:

void cab_manager::update_cab(id_type id, node_type from, node_type to)
{
    auto it = std::find_if(_cabs_at_node[from].begin(), _cabs_at_node[from].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[from].erase(it);
    _cabs_at_node[to].push_back(_cabs[id]);
}